

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int av1_tpl_stats_ready(TplParams *tpl_data,int gf_frame_index)

{
  int gf_frame_index_local;
  TplParams *tpl_data_local;
  uint local_4;
  
  if (tpl_data->ready == 0) {
    local_4 = 0;
  }
  else if (gf_frame_index < 0x60) {
    local_4 = (uint)tpl_data->tpl_frame[gf_frame_index].is_valid;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_tpl_stats_ready(const TplParams *tpl_data, int gf_frame_index) {
  if (tpl_data->ready == 0) {
    return 0;
  }
  if (gf_frame_index >= MAX_TPL_FRAME_IDX) {
    // The sub-GOP length exceeds the TPL buffer capacity.
    // Hence the TPL related functions are disabled hereafter.
    return 0;
  }
  return tpl_data->tpl_frame[gf_frame_index].is_valid;
}